

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall OpenMesh::PolyConnectivity::collapse_edge(PolyConnectivity *this,HalfedgeHandle _hh)

{
  HalfedgeHandle _heh;
  HalfedgeHandle _nheh;
  HalfedgeHandle _heh_00;
  FaceHandle _fh;
  FaceHandle _fh_00;
  VertexHandle _vh;
  VertexHandle _vh_00;
  undefined4 uVar1;
  value_type _heh_01;
  Halfedge *pHVar2;
  Vertex *pVVar3;
  Face *pFVar4;
  reference pvVar5;
  HalfedgeHandle _heh_02;
  undefined1 local_68 [8];
  VertexIHalfedgeIter vih_it;
  
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_hh);
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
       (pHVar2->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_hh);
  _heh.super_BaseHandle.idx_ = (BaseHandle)(pHVar2->prev_halfedge_handle_).super_BaseHandle.idx_;
  _heh_02.super_BaseHandle.idx_ =
       (BaseHandle)((-((uint)_hh.super_BaseHandle.idx_ & 1) | 1) + (int)_hh.super_BaseHandle.idx_);
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _nheh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _heh_00.super_BaseHandle.idx_ = (BaseHandle)(pHVar2->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_hh);
  _fh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _fh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_hh);
  _vh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar2 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _vh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pVVar3->halfedge_handle_).super_BaseHandle.idx_;
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  local_68 = (undefined1  [8])this;
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
       (int)vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
  if ((int)vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ != -1) {
    do {
      if (((int)vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      _heh_01 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                             *)local_68);
      pHVar2 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.super_BaseHandle.idx_);
      (pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
           (int)_vh.super_BaseHandle.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                    *)local_68);
    } while (vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  uVar1 = vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,_heh,
             (HalfedgeHandle)vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_)
  ;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_nheh);
  if (_fh.super_BaseHandle.idx_ != -1) {
    pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
    (pFVar4->halfedge_handle_).super_BaseHandle.idx_ = uVar1;
  }
  if (_fh_00.super_BaseHandle.idx_ != -1) {
    pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,_fh_00);
    (pFVar4->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
  }
  pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  if ((BaseHandle)(pVVar3->halfedge_handle_).super_BaseHandle.idx_ == _heh_02.super_BaseHandle.idx_)
  {
    pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
    (pVVar3->halfedge_handle_).super_BaseHandle.idx_ = uVar1;
  }
  adjust_outgoing_halfedge(this,_vh);
  pVVar3 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
  (pVVar3->halfedge_handle_).super_BaseHandle.idx_ = -1;
  pvVar5 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)((int)_hh.super_BaseHandle.idx_ >> 1));
  *(byte *)&pvVar5->status_ = (byte)pvVar5->status_ | 1;
  pvVar5 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).vertex_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (VertexHandle)_vh_00.super_BaseHandle.idx_);
  *(byte *)&pvVar5->status_ = (byte)pvVar5->status_ | 1;
  return;
}

Assistant:

void PolyConnectivity::collapse_edge(HalfedgeHandle _hh)
{
  HalfedgeHandle  h  = _hh;
  HalfedgeHandle  hn = next_halfedge_handle(h);
  HalfedgeHandle  hp = prev_halfedge_handle(h);

  HalfedgeHandle  o  = opposite_halfedge_handle(h);
  HalfedgeHandle  on = next_halfedge_handle(o);
  HalfedgeHandle  op = prev_halfedge_handle(o);

  FaceHandle      fh = face_handle(h);
  FaceHandle      fo = face_handle(o);

  VertexHandle    vh = to_vertex_handle(h);
  VertexHandle    vo = to_vertex_handle(o);



  // halfedge -> vertex
  for (VertexIHalfedgeIter vih_it(vih_iter(vo)); vih_it.is_valid(); ++vih_it)
    set_vertex_handle(*vih_it, vh);


  // halfedge -> halfedge
  set_next_halfedge_handle(hp, hn);
  set_next_halfedge_handle(op, on);


  // face -> halfedge
  if (fh.is_valid())  set_halfedge_handle(fh, hn);
  if (fo.is_valid())  set_halfedge_handle(fo, on);


  // vertex -> halfedge
  if (halfedge_handle(vh) == o)  set_halfedge_handle(vh, hn);
  adjust_outgoing_halfedge(vh);
  set_isolated(vo);

  // delete stuff
  status(edge_handle(h)).set_deleted(true);
  status(vo).set_deleted(true);
}